

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O2

int compare_keys(void *key1,void *key2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = *(int *)((long)key1 + 8);
  iVar2 = *(int *)((long)key2 + 8);
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  iVar3 = memcmp(*key1,*key2,(long)iVar3);
  if (iVar3 == 0) {
    iVar3 = iVar1 - iVar2;
  }
  return iVar3;
}

Assistant:

static int compare_keys(const void *key1, const void *key2) {
    const struct key_len *k1 = key1;
    const struct key_len *k2 = key2;
    const size_t min_size = k1->len < k2->len ? k1->len : k2->len;
    int res = memcmp(k1->key, k2->key, min_size);

    if (res)
        return res;

    return k1->len - k2->len;
}